

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O2

void __thiscall Assimp::FlipUVsProcess::ProcessMesh(FlipUVsProcess *this,aiMesh *pMesh)

{
  aiAnimMesh *paVar1;
  uint tcIdx;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint vIdx_1;
  ulong uVar6;
  
  if (pMesh != (aiMesh *)0x0) {
    lVar2 = 0;
    while (((lVar2 != 8 && (pMesh->mTextureCoords[lVar2] != (aiVector3D *)0x0)) &&
           (uVar5 = pMesh->mNumVertices, uVar5 != 0))) {
      lVar3 = 4;
      for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
        *(float *)((long)&pMesh->mTextureCoords[lVar2]->x + lVar3) =
             1.0 - *(float *)((long)&pMesh->mTextureCoords[lVar2]->x + lVar3);
        uVar5 = pMesh->mNumVertices;
        lVar3 = lVar3 + 0xc;
      }
      lVar2 = lVar2 + 1;
    }
  }
  for (uVar4 = 0; uVar4 < pMesh->mNumAnimMeshes; uVar4 = uVar4 + 1) {
    paVar1 = pMesh->mAnimMeshes[uVar4];
    if (paVar1 != (aiAnimMesh *)0x0) {
      for (lVar2 = 0; (lVar2 != 8 && (paVar1->mTextureCoords[lVar2] != (aiVector3D *)0x0));
          lVar2 = lVar2 + 1) {
        lVar3 = 4;
        for (uVar6 = 0; uVar6 < paVar1->mNumVertices; uVar6 = uVar6 + 1) {
          *(float *)((long)&paVar1->mTextureCoords[lVar2]->x + lVar3) =
               1.0 - *(float *)((long)&paVar1->mTextureCoords[lVar2]->x + lVar3);
          lVar3 = lVar3 + 0xc;
        }
      }
    }
  }
  return;
}

Assistant:

void flipUVs(aiMeshType* pMesh) {
    if (pMesh == nullptr) { return; }
    // mirror texture y coordinate
    for (unsigned int tcIdx = 0; tcIdx < AI_MAX_NUMBER_OF_TEXTURECOORDS; tcIdx++) {
        if (!pMesh->HasTextureCoords(tcIdx)) {
            break;
        }

        for (unsigned int vIdx = 0; vIdx < pMesh->mNumVertices; vIdx++) {
            pMesh->mTextureCoords[tcIdx][vIdx].y = 1.0f - pMesh->mTextureCoords[tcIdx][vIdx].y;
        }
    }
}